

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wbmp.c
# Opt level: O3

Wbmp * createwbmp(int width,int height,int color)

{
  undefined1 auVar1 [16];
  int iVar2;
  Wbmp *ptr;
  int *piVar3;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  int iVar11;
  
  ptr = (Wbmp *)gdMalloc(0x18);
  if (ptr != (Wbmp *)0x0) {
    iVar2 = overflow2(4,width);
    if (iVar2 == 0) {
      iVar2 = overflow2((int)((long)width * 4),height);
      if (iVar2 == 0) {
        piVar3 = (int *)gdMalloc((long)width * 4 * (long)height);
        ptr->bitmap = piVar3;
        if (piVar3 != (int *)0x0) {
          ptr->width = width;
          ptr->height = height;
          auVar1 = _DAT_00123050;
          uVar6 = height * width;
          if ((int)uVar6 < 1) {
            return ptr;
          }
          lVar4 = (ulong)uVar6 - 1;
          auVar7._8_4_ = (int)lVar4;
          auVar7._0_8_ = lVar4;
          auVar7._12_4_ = (int)((ulong)lVar4 >> 0x20);
          uVar5 = 0;
          auVar7 = auVar7 ^ _DAT_00123050;
          auVar8 = _DAT_00124da0;
          auVar9 = _DAT_00123040;
          do {
            auVar10 = auVar9 ^ auVar1;
            iVar2 = auVar7._4_4_;
            if ((bool)(~(auVar10._4_4_ == iVar2 && auVar7._0_4_ < auVar10._0_4_ ||
                        iVar2 < auVar10._4_4_) & 1)) {
              piVar3[uVar5] = color;
            }
            if ((auVar10._12_4_ != auVar7._12_4_ || auVar10._8_4_ <= auVar7._8_4_) &&
                auVar10._12_4_ <= auVar7._12_4_) {
              piVar3[uVar5 + 1] = color;
            }
            auVar10 = auVar8 ^ auVar1;
            iVar11 = auVar10._4_4_;
            if (iVar11 <= iVar2 && (iVar11 != iVar2 || auVar10._0_4_ <= auVar7._0_4_)) {
              piVar3[uVar5 + 2] = color;
              piVar3[uVar5 + 3] = color;
            }
            uVar5 = uVar5 + 4;
            lVar4 = auVar9._8_8_;
            auVar9._0_8_ = auVar9._0_8_ + 4;
            auVar9._8_8_ = lVar4 + 4;
            lVar4 = auVar8._8_8_;
            auVar8._0_8_ = auVar8._0_8_ + 4;
            auVar8._8_8_ = lVar4 + 4;
          } while ((uVar6 + 3 & 0xfffffffc) != uVar5);
          return ptr;
        }
      }
    }
    gdFree(ptr);
  }
  return (Wbmp *)0x0;
}

Assistant:

Wbmp *createwbmp(int width, int height, int color)
{
	int i;
	Wbmp *wbmp;

	if((wbmp = (Wbmp *)gdMalloc(sizeof (Wbmp))) == NULL) {
		return (NULL);
	}

	if(overflow2(sizeof(int), width)) {
		gdFree(wbmp);
		return NULL;
	}

	if(overflow2(sizeof(int) * width, height)) {
		gdFree(wbmp);
		return NULL;
	}

	if((wbmp->bitmap = (int *)gdMalloc(sizeof(int) * width * height)) == NULL) {
		gdFree(wbmp);
		return NULL;
	}

	wbmp->width = width;
	wbmp->height = height;

	for(i = 0; i < width * height; wbmp->bitmap[i++] = color);

	return wbmp;
}